

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double gamln1(double *a)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *a;
  if (0.6 <= dVar1) {
    dVar1 = dVar1 + -0.5 + -0.5;
    dVar2 = (((((dVar1 * 0.000497958207639485 + 0.017050248402265) * dVar1 + 0.156513060486551) *
               dVar1 + 0.565221050691933) * dVar1 + 0.848044614534529) * dVar1 + 0.422784335098467)
            / (((((dVar1 * 0.000116165475989616 + 0.00713309612391) * dVar1 + 0.10155218743983) *
                 dVar1 + 0.548042109832463) * dVar1 + 1.24313399877507) * dVar1 + 1.0);
  }
  else {
    dVar2 = ((((((dVar1 * -0.00271935708322958 + -0.0673562214325671) * dVar1 + -0.402055799310489)
                * dVar1 + -0.780427615533591) * dVar1 + -0.168860593646662) * dVar1 +
             0.844203922187225) * dVar1 + 0.577215664901533) /
            ((((((dVar1 * 0.000667465618796164 + 0.0325038868253937) * dVar1 + 0.361951990101499) *
                dVar1 + 1.56875193295039) * dVar1 + 3.12755088914843) * dVar1 + 2.88743195473681) *
             dVar1 + 1.0);
    dVar1 = -dVar1;
  }
  return dVar1 * dVar2;
}

Assistant:

double gamln1(double *a)
/*
-----------------------------------------------------------------------
     EVALUATION OF LN(GAMMA(1 + A)) FOR -0.2 .LE. A .LE. 1.25
-----------------------------------------------------------------------
*/
{
static double p0 = .577215664901533e+00;
static double p1 = .844203922187225e+00;
static double p2 = -.168860593646662e+00;
static double p3 = -.780427615533591e+00;
static double p4 = -.402055799310489e+00;
static double p5 = -.673562214325671e-01;
static double p6 = -.271935708322958e-02;
static double q1 = .288743195473681e+01;
static double q2 = .312755088914843e+01;
static double q3 = .156875193295039e+01;
static double q4 = .361951990101499e+00;
static double q5 = .325038868253937e-01;
static double q6 = .667465618796164e-03;
static double r0 = .422784335098467e+00;
static double r1 = .848044614534529e+00;
static double r2 = .565221050691933e+00;
static double r3 = .156513060486551e+00;
static double r4 = .170502484022650e-01;
static double r5 = .497958207639485e-03;
static double s1 = .124313399877507e+01;
static double s2 = .548042109832463e+00;
static double s3 = .101552187439830e+00;
static double s4 = .713309612391000e-02;
static double s5 = .116165475989616e-03;
static double gamln1,w,x;
/*
     ..
     .. Executable Statements ..
*/
    if(*a >= 0.6e0) goto S10;
    w = ((((((p6**a+p5)**a+p4)**a+p3)**a+p2)**a+p1)**a+p0)/((((((q6**a+q5)**a+
      q4)**a+q3)**a+q2)**a+q1)**a+1.0e0);
    gamln1 = -(*a*w);
    return gamln1;
S10:
    x = *a-0.5e0-0.5e0;
    w = (((((r5*x+r4)*x+r3)*x+r2)*x+r1)*x+r0)/(((((s5*x+s4)*x+s3)*x+s2)*x+s1)*x
      +1.0e0);
    gamln1 = x*w;
    return gamln1;
}